

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O3

Gia_Man_t * Ssc_PerformSweepingConstr(Gia_Man_t *p,Ssc_Pars_t *pPars)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  uint *__ptr;
  int *pPos;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  ulong uVar9;
  Gia_Man_t *pGVar10;
  Gia_Man_t *p_00;
  ulong uVar11;
  Gia_Man_t *pAig;
  int iVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (pPars->fVerbose != 0) {
    Abc_Print(0,"SAT sweeping AIG with %d constraints.\n",(ulong)(uint)p->nConstrs);
  }
  iVar5 = p->nConstrs;
  if (iVar5 == 0) {
    pGVar10 = Gia_ManDup(p);
    p_00 = Gia_ManStart(p->vCis->nSize + 2);
    pcVar6 = (char *)malloc(5);
    builtin_strncpy(pcVar6,"care",5);
    p_00->pName = pcVar6;
    if (p->vCis->nSize < 1) {
      iVar5 = p_00->nObjs;
    }
    else {
      iVar12 = 0;
      do {
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar9 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar9 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar9 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_00->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_005bebaa;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
        if ((pGVar7 < p_00->pObjs) || (iVar5 = p_00->nObjs, p_00->pObjs + iVar5 <= pGVar7))
        goto LAB_005bebaa;
        iVar12 = iVar12 + 1;
      } while (iVar12 < p->vCis->nSize);
    }
    if (iVar5 < 1) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    if ((~*(uint *)p_00->pObjs & 0x1fffffff) != 0 && (int)*(uint *)p_00->pObjs < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar7 = Gia_ManAppendObj(p_00);
    uVar9 = *(ulong *)pGVar7;
    *(ulong *)pGVar7 = uVar9 | 0x80000000;
    pGVar2 = p_00->pObjs;
    if ((pGVar2 <= pGVar7) && (pGVar7 < pGVar2 + p_00->nObjs)) {
      uVar11 = (ulong)(((uint)((int)pGVar7 - (int)pGVar2) >> 2) * -0x55555555 & 0x1fffffff);
      *(ulong *)pGVar7 = uVar9 & 0xffffffffc0000000 | 0x80000000 | uVar11;
      *(ulong *)pGVar7 =
           uVar9 & 0xe0000000c0000000 | 0x80000000 | uVar11 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar2 <= pGVar7) && (pGVar7 < pGVar2 + p_00->nObjs)) {
        Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),pGVar7);
        }
        if ((p_00->pObjs <= pGVar7) && (pGVar7 < p_00->pObjs + p_00->nObjs)) goto LAB_005beb0b;
      }
    }
LAB_005bebaa:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar12 = p->nRegs;
  iVar1 = p->vCos->nSize;
  uVar13 = iVar1 - iVar12;
  __ptr = (uint *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar13 - 1) {
    uVar4 = uVar13;
  }
  *__ptr = uVar4;
  if (uVar4 == 0) {
    pPos = (int *)0x0;
  }
  else {
    pPos = (int *)malloc((long)(int)uVar4 << 2);
  }
  *(int **)(__ptr + 2) = pPos;
  __ptr[1] = uVar13;
  auVar3 = _DAT_008403e0;
  if (0 < (int)uVar13) {
    lVar8 = (ulong)uVar13 - 1;
    auVar14._8_4_ = (int)lVar8;
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar9 = 0;
    auVar14 = auVar14 ^ _DAT_008403e0;
    auVar15 = _DAT_008403d0;
    do {
      auVar16 = auVar15 ^ auVar3;
      if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                  auVar14._4_4_ < auVar16._4_4_) & 1)) {
        pPos[uVar9] = (int)uVar9;
      }
      if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
          auVar16._12_4_ <= auVar14._12_4_) {
        pPos[uVar9 + 1] = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar8 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar8 + 2;
    } while ((uVar13 + 1 & 0xfffffffe) != uVar9);
  }
  pGVar10 = Gia_ManDupCones(p,pPos,iVar1 - (iVar12 + iVar5),0);
  p_00 = Gia_ManDupCones(p,pPos + (((long)p->vCos->nSize - (long)p->nRegs) - (long)p->nConstrs),
                         p->nConstrs,0);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
LAB_005beb0b:
  if (pPars->fVerbose != 0) {
    printf("User AIG: ");
    Gia_ManPrintStats(pGVar10,(Gps_Par_t *)0x0);
    printf("Care AIG: ");
    Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  }
  pAig = Gia_ManDupLevelized(pGVar10);
  Gia_ManStop(pGVar10);
  pGVar10 = Ssc_PerformSweeping(pAig,p_00,pPars);
  if (pPars->fAppend != 0) {
    Gia_ManDupAppendShare(pGVar10,p_00);
    pGVar10->nConstrs = p_00->vCos->nSize - p_00->nRegs;
  }
  Gia_ManStop(pAig);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingConstr( Gia_Man_t * p, Ssc_Pars_t * pPars )
{
    Gia_Man_t * pAig, * pCare, * pResult;
    int i;
    if ( pPars->fVerbose )
        Abc_Print( 0, "SAT sweeping AIG with %d constraints.\n", p->nConstrs );
    if ( p->nConstrs == 0 )
    {
        pAig = Gia_ManDup( p );
        pCare = Gia_ManStart( Gia_ManCiNum(p) + 2 );
        pCare->pName = Abc_UtilStrsav( "care" );
        for ( i = 0; i < Gia_ManCiNum(p); i++ )
            Gia_ManAppendCi( pCare );
        Gia_ManAppendCo( pCare, 0 );
    }
    else
    {
        Vec_Int_t * vOuts = Vec_IntStartNatural( Gia_ManPoNum(p) );
        pAig = Gia_ManDupCones( p, Vec_IntArray(vOuts), Gia_ManPoNum(p) - p->nConstrs, 0 );
        pCare = Gia_ManDupCones( p, Vec_IntArray(vOuts) + Gia_ManPoNum(p) - p->nConstrs, p->nConstrs, 0 );
        Vec_IntFree( vOuts );
    }
    if ( pPars->fVerbose )
    {
        printf( "User AIG: " );
        Gia_ManPrintStats( pAig, NULL );
        printf( "Care AIG: " );
        Gia_ManPrintStats( pCare, NULL );
    }

    pAig = Gia_ManDupLevelized( pResult = pAig );
    Gia_ManStop( pResult );
    pResult = Ssc_PerformSweeping( pAig, pCare, pPars );
    if ( pPars->fAppend )
    {
        Gia_ManDupAppendShare( pResult, pCare );
        pResult->nConstrs = Gia_ManPoNum(pCare);
    }
    Gia_ManStop( pAig );
    Gia_ManStop( pCare );
    return pResult;
}